

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

NLHeader * ReadHeader(int line_index,StringRef line)

{
  NLHeader *in_RDI;
  bool in_stack_000000d7;
  NLHeader *in_stack_000000d8;
  undefined1 local_168 [28];
  int in_stack_fffffffffffffeb4;
  string *in_stack_fffffffffffffeb8;
  StringRef in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffee0;
  string local_58 [32];
  string local_38 [56];
  
  memset(local_168,0,0x110);
  mp::NLHeader::NLHeader(in_RDI);
  FormatHeader_abi_cxx11_(in_stack_000000d8,in_stack_000000d7);
  ReplaceLine(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffec0);
  ReadHeader(in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  return in_RDI;
}

Assistant:

NLHeader ReadHeader(int line_index, fmt::StringRef line) {
  return ReadHeader(ReplaceLine(FormatHeader(NLHeader()), line_index, line));
}